

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

ostream * operator<<(ostream *out,Matrix *matrix)

{
  _Setw _Var1;
  _Setprecision _Var2;
  ostream *poVar3;
  double dVar4;
  int local_28;
  int local_24;
  int j;
  int i;
  Matrix *matrix_local;
  ostream *out_local;
  
  _Var1 = std::setw(8);
  poVar3 = std::operator<<(out,_Var1);
  _Var2 = std::setprecision(4);
  std::operator<<(poVar3,_Var2);
  for (local_24 = 0; local_24 < matrix->rows; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < matrix->cols; local_28 = local_28 + 1) {
      _Var1 = std::setw(8);
      poVar3 = std::operator<<(out,_Var1);
      dVar4 = Matrix::operator()(matrix,local_24,local_28);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4);
      std::operator<<(poVar3,' ');
    }
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Matrix& matrix)
{
    out << std::setw(8) << std::setprecision(4);
    for (int i = 0; i < matrix.rows; i++)
    {
        for (int j = 0; j < matrix.cols; j++)
        {
            out << std::setw(8) << matrix(i, j) << ' ';
        }
        out << std::endl;
    }

    return out;
}